

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O2

unsigned_long PaUtil_CopyOutput(PaUtilBufferProcessor *bp,void **buffer,unsigned_long frameCount)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  PaUtilChannelDescriptor *pPVar7;
  void *pvVar8;
  
  if (bp->hostOutputFrameCount[0] < frameCount) {
    frameCount = bp->hostOutputFrameCount[0];
  }
  pPVar7 = bp->hostOutputChannels[0];
  pvVar8 = *buffer;
  uVar5 = (uint)frameCount;
  if (bp->userOutputIsInterleaved == 0) {
    for (uVar6 = 0; uVar6 < bp->outputChannelCount; uVar6 = uVar6 + 1) {
      pvVar3 = *(void **)((long)pvVar8 + uVar6 * 8);
      (*bp->outputConverter)(pPVar7->data,pPVar7->stride,pvVar3,1,uVar5,&bp->ditherGenerator);
      *(ulong *)((long)pvVar8 + uVar6 * 8) =
           (ulong)(bp->bytesPerUserOutputSample * uVar5) + (long)pvVar3;
      pPVar7->data = (void *)((long)pPVar7->data +
                             (ulong)(pPVar7->stride * uVar5 * bp->bytesPerHostOutputSample));
      pPVar7 = pPVar7 + 1;
    }
  }
  else {
    uVar1 = bp->outputChannelCount;
    uVar2 = bp->bytesPerUserOutputSample;
    uVar4 = uVar1;
    for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      (*bp->outputConverter)(pPVar7->data,pPVar7->stride,pvVar8,uVar1,uVar5,&bp->ditherGenerator);
      pPVar7->data = (void *)((long)pPVar7->data +
                             (ulong)(pPVar7->stride * uVar5 * bp->bytesPerHostOutputSample));
      pvVar8 = (void *)((long)pvVar8 + (ulong)uVar2);
      uVar4 = bp->outputChannelCount;
      pPVar7 = pPVar7 + 1;
    }
    *buffer = (void *)((long)*buffer + (ulong)(uVar4 * uVar5 * bp->bytesPerUserOutputSample));
  }
  bp->hostOutputFrameCount[0] = bp->hostOutputFrameCount[0] + (frameCount & 0xffffffff);
  return frameCount & 0xffffffff;
}

Assistant:

unsigned long PaUtil_CopyOutput( PaUtilBufferProcessor* bp,
        const void ** buffer, unsigned long frameCount )
{
    PaUtilChannelDescriptor *hostOutputChannels;
    unsigned int framesToCopy;
    unsigned char *srcBytePtr;
    void **nonInterleavedSrcPtrs;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;

    hostOutputChannels = bp->hostOutputChannels[0];
    framesToCopy = PA_MIN_( bp->hostOutputFrameCount[0], frameCount );

    if( bp->userOutputIsInterleaved )
    {
        srcBytePtr = (unsigned char*)*buffer;
        
        srcSampleStrideSamples = bp->outputChannelCount;
        srcChannelStrideBytes = bp->bytesPerUserOutputSample;

        for( i=0; i<bp->outputChannelCount; ++i )
        {
            bp->outputConverter(    hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    srcBytePtr, srcSampleStrideSamples,
                                    framesToCopy, &bp->ditherGenerator );

            srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

            /* advance dest ptr for next iteration */
            hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                    framesToCopy * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
        }

        /* advance callers source pointer (buffer) */
        *buffer = ((unsigned char *)*buffer) +
                framesToCopy * bp->outputChannelCount * bp->bytesPerUserOutputSample;

    }
    else
    {
        /* user output is not interleaved */
        
        nonInterleavedSrcPtrs = (void**)*buffer;

        srcSampleStrideSamples = 1;
        
        for( i=0; i<bp->outputChannelCount; ++i )
        {
            srcBytePtr = (unsigned char*)nonInterleavedSrcPtrs[i];
            
            bp->outputConverter(    hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    srcBytePtr, srcSampleStrideSamples,
                                    framesToCopy, &bp->ditherGenerator );


            /* advance callers source pointer (nonInterleavedSrcPtrs[i]) */
            srcBytePtr += bp->bytesPerUserOutputSample * framesToCopy;
            nonInterleavedSrcPtrs[i] = srcBytePtr;
            
            /* advance dest ptr for next iteration */
            hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                    framesToCopy * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
        }
    }

    bp->hostOutputFrameCount[0] += framesToCopy;
    
    return framesToCopy;
}